

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O3

void crnlib::LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  uVar10 = p->tableSize;
  uVar4 = (ulong)uVar10;
  uVar5 = (p->p).choice >> 2 & 0xfffffffc;
  iVar8 = *(int *)((long)ProbPrices + (ulong)uVar5);
  iVar1 = *(int *)((long)ProbPrices + (ulong)(uVar5 ^ 0x1fc));
  uVar5 = (p->p).choice2 >> 2 & 0xfffffffc;
  iVar2 = *(int *)((long)ProbPrices + (ulong)uVar5);
  iVar3 = *(int *)((long)ProbPrices + (ulong)(uVar5 ^ 0x1fc));
  uVar5 = 7;
  if (uVar10 < 7) {
    uVar5 = uVar10;
  }
  uVar11 = 7;
  if (uVar4 < 7) {
    uVar11 = uVar4;
  }
  uVar11 = uVar11 + 1;
  uVar9 = 0;
  uVar5 = 0x10 - uVar5;
  do {
    uVar6 = uVar5;
    if (uVar9 == uVar4) goto LAB_001a2aa0;
    iVar12 = 0;
    uVar5 = (uint)uVar9 | 8;
    do {
      uVar7 = uVar5 >> 1;
      iVar12 = iVar12 + ProbPrices
                        [(-(uVar5 & 1) & 0x7f0 ^
                         (uint)*(ushort *)
                                ((long)(p->p).low +
                                (ulong)(uVar5 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
      uVar5 = uVar7;
    } while (uVar7 != 1);
    p->prices[posState][uVar9] = iVar12 + iVar8;
    uVar9 = uVar9 + 1;
    uVar5 = uVar6 + 1;
  } while (uVar9 != 8);
  uVar9 = (ulong)uVar6;
  do {
    if (uVar4 <= uVar11) goto LAB_001a2aa0;
    iVar8 = 0;
    uVar5 = (int)uVar11 - 8U | 8;
    do {
      uVar7 = uVar5 >> 1;
      iVar8 = iVar8 + ProbPrices
                      [(-(uVar5 & 1) & 0x7f0 ^
                       (uint)*(ushort *)
                              ((long)(p->p).mid +
                              (ulong)(uVar5 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
      uVar5 = uVar7;
    } while (uVar7 != 1);
    p->prices[posState][uVar11] = iVar8 + iVar2 + iVar1;
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar9);
  if (uVar6 < uVar10) {
    do {
      iVar8 = 0;
      uVar10 = (int)uVar9 - 0x10U | 0x100;
      do {
        uVar5 = uVar10 >> 1;
        iVar8 = iVar8 + ProbPrices
                        [(-(uVar10 & 1) & 0x7f0 ^
                         (uint)*(ushort *)((long)(p->p).high + (ulong)(uVar10 & 0xfffffffe))) >> 4];
        uVar10 = uVar5;
      } while (uVar5 != 1);
      p->prices[posState][uVar9] = iVar8 + iVar1 + iVar3;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar4);
  }
LAB_001a2aa0:
  p->counters[posState] = p->tableSize;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc* p, UInt32 posState, UInt32* ProbPrices) {
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}